

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

gnode_t * parse_literal_expression(gravity_parser_t *parser)

{
  char cVar1;
  int iVar2;
  gravity_delegate_t *pgVar3;
  size_t sVar4;
  lexer_r *plVar5;
  gnode_r *pgVar6;
  double d;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  gtoken_s token_04;
  gtoken_s token_05;
  gtoken_s token_06;
  gtoken_s token_07;
  gtoken_s token_08;
  gtoken_s token_09;
  gtoken_s token_10;
  gtoken_s token_11;
  uint32_t uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  byte bVar12;
  gtoken_t token_12;
  uint32_t uVar13;
  gnode_t *pgVar14;
  char *pcVar15;
  size_t sVar16;
  char *pcVar17;
  gravity_lexer_t *pgVar18;
  gravity_lexer_t **ppgVar19;
  gnode_t *pgVar20;
  gnode_t **ppgVar21;
  __int32_t **pp_Var22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  _Bool allocated;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  gnode_n tag;
  size_t sVar31;
  undefined8 in_R8;
  undefined8 in_R9;
  uint32_t uVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  uint32_t len;
  gtoken_s token;
  char b [3];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  gnode_r *local_290;
  uint32_t local_284;
  undefined4 local_280;
  uint uStack_27c;
  uint uStack_278;
  undefined4 uStack_274;
  uint32_t local_270;
  undefined4 uStack_26c;
  uint32_t uStack_268;
  int iStack_264;
  char *local_260;
  gnode_t *local_258;
  char *local_250;
  gravity_lexer_t *local_248;
  ulong local_240;
  undefined1 local_238 [2];
  char cStack_236;
  char cStack_235;
  char cStack_234;
  char cStack_233;
  char cStack_232;
  char cStack_231;
  ulong uStack_230;
  char *local_218;
  
  pgVar18 = parser->lexer->p[parser->lexer->n - 1];
  token_12 = gravity_lexer_next(pgVar18);
  gravity_lexer_token(pgVar18);
  pcVar17 = local_260;
  iVar30 = iStack_264;
  uVar32 = uStack_268;
  uVar10 = uStack_26c;
  uVar7 = local_270;
  uVar9 = uStack_274;
  uVar29 = uStack_278;
  uVar28 = uStack_27c;
  uVar8 = local_280;
  if (token_12 != TOK_STRING) {
    if (token_12 - TOK_KEY_TRUE < 2) {
      sVar4 = parser->declarations->n;
      if (sVar4 == 0) {
        pgVar14 = (gnode_t *)0x0;
      }
      else {
        pgVar14 = parser->declarations->p[sVar4 - 1];
      }
      token_04.lineno = uStack_27c;
      token_04.type = local_280;
      token_04.colno = uStack_278;
      token_04.position = uStack_274;
      token_04.bytes = local_270;
      token_04.length = uStack_26c;
      token_04.fileid = uStack_268;
      token_04.builtin = iStack_264;
      token_04.value = local_260;
      pgVar14 = gnode_literal_bool_expr_create(token_04,(uint)(token_12 == TOK_KEY_TRUE),pgVar14);
      return pgVar14;
    }
    if (token_12 != TOK_NUMBER) {
      pcVar17 = token_name(token_12);
      token_02.lineno = uStack_27c;
      token_02.type = local_280;
      token_02.colno = uStack_278;
      token_02.position = uStack_274;
      token_02.bytes = local_270;
      token_02.length = uStack_26c;
      token_02.fileid = uStack_268;
      token_02.builtin = iStack_264;
      token_02.value = local_260;
      report_error(parser,GRAVITY_ERROR_SYNTAX,token_02,"Expected literal expression but found %s.",
                   pcVar17,in_R8,in_R9);
      return (gnode_t *)0x0;
    }
    uVar24 = uStack_278;
    if ((iStack_264 == 2) || (uVar24 = uStack_27c, iStack_264 == 1)) {
      uVar23 = (ulong)uVar24;
      sVar4 = parser->declarations->n;
      if (sVar4 == 0) {
        pgVar14 = (gnode_t *)0x0;
      }
      else {
        pgVar14 = parser->declarations->p[sVar4 - 1];
      }
      goto LAB_0010dadc;
    }
    if (*local_260 == '0') {
      pp_Var22 = __ctype_toupper_loc();
      iVar2 = (*pp_Var22)[pcVar17[1]];
      if (iVar2 == 0x58) {
        uVar23 = 0;
        memset(local_238,0,0x200);
        local_284 = 0;
        token_09.lineno = uStack_27c;
        token_09.type = local_280;
        token_09.colno = uStack_278;
        token_09.position = uStack_274;
        token_09.bytes = local_270;
        token_09.length = uStack_26c;
        token_09.fileid = uStack_268;
        token_09.builtin = iStack_264;
        token_09.value = local_260;
        pcVar15 = token_string(token_09,&local_284);
        if (local_284 != 0) {
          uVar24 = 0x200;
          if (local_284 < 0x200) {
            uVar24 = local_284;
          }
          memcpy(local_238,pcVar15,(ulong)uVar24);
          uVar23 = number_from_hex(local_238,uVar7);
        }
LAB_0010dce3:
        bVar35 = false;
      }
      else {
        if (iVar2 == 0x4f) {
          uVar23 = 0;
          memset(local_238,0,0x200);
          local_284 = 0;
          token_08.lineno = uStack_27c;
          token_08.type = local_280;
          token_08.colno = uStack_278;
          token_08.position = uStack_274;
          token_08.bytes = local_270;
          token_08.length = uStack_26c;
          token_08.fileid = uStack_268;
          token_08.builtin = iStack_264;
          token_08.value = local_260;
          pcVar15 = token_string(token_08,&local_284);
          uVar13 = local_284;
          if (local_284 != 0) {
            uVar24 = 0x200;
            if (local_284 < 0x200) {
              uVar24 = local_284;
            }
            memcpy(local_238,pcVar15,(ulong)uVar24);
            uVar23 = number_from_oct(local_238 + 2,uVar13 - 2);
          }
          goto LAB_0010dce3;
        }
        if (iVar2 == 0x42) {
          uVar23 = number_from_bin(pcVar17 + 2,uVar7 - 2);
          goto LAB_0010dce3;
        }
        bVar35 = true;
        uVar23 = 0;
      }
      if (bVar35) goto LAB_0010dcf4;
    }
    else {
LAB_0010dcf4:
      bVar35 = uVar7 != 0;
      if (bVar35) {
        bVar35 = true;
        uVar23 = 1;
        do {
          if ((pcVar17[uVar23 - 1] == '.') || (pcVar17[uVar23 - 1] == 'e')) break;
          bVar35 = uVar23 < uVar7;
          bVar34 = uVar23 != uVar7;
          uVar23 = uVar23 + 1;
        } while (bVar34);
      }
      memset(local_238,0,0x200);
      local_284 = 0;
      token_10.lineno = uVar28;
      token_10.type = uVar8;
      token_10.colno = uVar29;
      token_10.position = uVar9;
      token_10.bytes = uVar7;
      token_10.length = uVar10;
      token_10.fileid = uVar32;
      token_10.builtin = iVar30;
      token_10.value = pcVar17;
      pcVar15 = token_string(token_10,&local_284);
      uVar13 = local_284;
      if (local_284 != 0) {
        uVar24 = 0x200;
        if (local_284 < 0x200) {
          uVar24 = local_284;
        }
        memcpy(local_238,pcVar15,(ulong)uVar24);
      }
      if (0x1ff < uVar13) {
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x141ad0);
        return (gnode_t *)0x0;
      }
      if (bVar35) {
        pgVar14 = (gnode_t *)0x0;
        d = strtod(local_238,(char **)0x0);
        sVar4 = parser->declarations->n;
        if (sVar4 != 0) {
          pgVar14 = parser->declarations->p[sVar4 - 1];
        }
        token_11.lineno = uVar28;
        token_11.type = uVar8;
        token_11.colno = uVar29;
        token_11.position = uVar9;
        token_11.bytes = uVar7;
        token_11.length = uVar10;
        token_11.fileid = uVar32;
        token_11.builtin = iVar30;
        token_11.value = pcVar17;
        pgVar14 = gnode_literal_float_expr_create(token_11,d,pgVar14);
        return pgVar14;
      }
      uVar23 = strtoll(local_238,(char **)0x0,0);
    }
    sVar4 = parser->declarations->n;
    if (sVar4 == 0) {
      pgVar14 = (gnode_t *)0x0;
    }
    else {
      pgVar14 = parser->declarations->p[sVar4 - 1];
    }
LAB_0010dadc:
    token_05.lineno = uVar28;
    token_05.type = uVar8;
    token_05.colno = uVar29;
    token_05.position = uVar9;
    token_05.bytes = uVar7;
    token_05.length = uVar10;
    token_05.fileid = uVar32;
    token_05.builtin = iVar30;
    token_05.value = pcVar17;
    pgVar14 = gnode_literal_int_expr_create(token_05,uVar23,pgVar14);
    return pgVar14;
  }
  local_284 = 0;
  token_00.lineno = uStack_27c;
  token_00.type = local_280;
  token_00.colno = uStack_278;
  token_00.position = uStack_274;
  token_00.bytes = local_270;
  token_00.length = uStack_26c;
  token_00.fileid = uStack_268;
  token_00.builtin = iStack_264;
  token_00.value = local_260;
  pgVar14 = (gnode_t *)token_string(token_00,&local_284);
  uVar7 = local_284;
  uVar23 = (ulong)local_284;
  local_2a8 = CONCAT44(uStack_26c,local_270);
  uStack_2a0 = CONCAT44(iStack_264,uStack_268);
  local_2b8 = CONCAT44(uStack_27c,local_280);
  uStack_2b0 = CONCAT44(uStack_274,uStack_278);
  if (iStack_264 == 5) {
    tag = NODE_CLASS_DECL;
LAB_0010d8da:
    pgVar14 = get_enclosing(parser,tag);
    if (pgVar14 == (gnode_t *)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar15 = *(char **)&pgVar14[1].token.colno;
      pcVar17 = "";
      if (pcVar15 != (char *)0x0) {
        pcVar17 = pcVar15;
      }
    }
    sVar16 = strlen(pcVar17);
    uVar32 = (uint32_t)sVar16;
    sVar4 = parser->declarations->n;
    if (sVar4 == 0) {
      pgVar14 = (gnode_t *)0x0;
    }
    else {
      pgVar14 = parser->declarations->p[sVar4 - 1];
    }
  }
  else {
    if (iStack_264 == 4) {
      tag = NODE_FUNCTION_DECL;
      goto LAB_0010d8da;
    }
    if (((iStack_264 != 3) || (pgVar3 = parser->delegate, pgVar3 == (gravity_delegate_t *)0x0)) ||
       (pgVar3->filename_callback == (gravity_filename_callback)0x0)) {
      uVar28 = local_284 + 1;
      uVar32 = 0;
      pcVar17 = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)uVar28);
      iVar30 = 2;
      if (uVar7 == 0) {
        local_290 = (gnode_r *)0x0;
      }
      else {
        local_290 = (gnode_r *)0x0;
        uVar33 = 0;
        uVar26 = 0;
        local_240 = (ulong)uVar28;
        do {
          uVar11 = _local_238;
          uVar29 = (uint)uVar26;
          bVar12 = *(byte *)((long)&pgVar14->tag + uVar26);
          uVar32 = (uint32_t)uVar33;
          uVar28 = uVar29;
          if (bVar12 != 0x5c) goto LAB_0010d6dc;
          uVar24 = uVar29 + 1;
          if (uVar7 <= uVar24) goto LAB_0010d552;
          bVar12 = *(byte *)((long)&pgVar14->tag + (ulong)uVar24);
          if (bVar12 < 0x62) {
            if (bVar12 < 0x55) {
              uVar28 = uVar24;
              if ((bVar12 != 0x22) && (bVar12 != 0x27)) {
                if (bVar12 != 0x28) goto switchD_0010d36e_caseD_6f;
                uVar29 = uVar29 + 2;
                iVar30 = 0;
                bVar35 = false;
                uVar26 = (ulong)uVar29;
                uVar28 = uVar29;
                do {
                  uVar13 = uVar7;
                  if (uVar23 <= uVar26) break;
                  cVar1 = *(char *)((long)&pgVar14->tag + uVar26);
                  if (cVar1 == '(') {
                    iVar30 = iVar30 + 1;
                  }
                  else if ((cVar1 == ')') && (bVar34 = iVar30 == 0, iVar30 = iVar30 + -1, bVar34)) {
                    iVar30 = 0;
                    bVar35 = true;
                  }
                  uVar26 = uVar26 + 1;
                  uVar28 = uVar28 + 1;
                  uVar13 = uVar28;
                } while (!bVar35);
                local_250 = pcVar17;
                if ((bool)(bVar35 & iVar30 == 0)) {
                  pgVar18 = gravity_lexer_create
                                      ((char *)((long)&pgVar14->tag + (ulong)uVar29),
                                       (ulong)(uVar13 - uVar29),0,true);
                  plVar5 = parser->lexer;
                  sVar4 = plVar5->m;
                  if (plVar5->n == sVar4) {
                    sVar31 = sVar4 * 2;
                    if (sVar4 == 0) {
                      sVar31 = 8;
                    }
                    plVar5->m = sVar31;
                    ppgVar19 = (gravity_lexer_t **)realloc(plVar5->p,sVar31 << 3);
                    parser->lexer->p = ppgVar19;
                  }
                  plVar5 = parser->lexer;
                  sVar4 = plVar5->n;
                  plVar5->n = sVar4 + 1;
                  plVar5->p[sVar4] = pgVar18;
                  local_248 = pgVar18;
                  pgVar20 = parse_precedence(parser,PREC_LOWEST);
                  if (pgVar20 != (gnode_t *)0x0) {
                    local_218 = local_260;
                    _local_238 = local_2b8;
                    uStack_230 = uStack_2b0;
                    (pgVar20->token).bytes = local_270;
                    (pgVar20->token).length = uStack_26c;
                    (pgVar20->token).fileid = uStack_268;
                    (pgVar20->token).builtin = iStack_264;
                    (pgVar20->token).value = local_260;
                    (pgVar20->token).type = local_280;
                    (pgVar20->token).lineno = uStack_27c;
                    (pgVar20->token).colno = uStack_278;
                    (pgVar20->token).position = uStack_274;
                    if (pgVar20->tag == NODE_POSTFIX_EXPR) {
                      lVar27 = *(long *)(pgVar20 + 1);
                      if (lVar27 != 0) {
                        *(char **)(lVar27 + 0x30) = local_260;
                        *(undefined8 *)(lVar27 + 0x20) = local_2a8;
                        *(undefined8 *)(lVar27 + 0x28) = uStack_2a0;
                        *(undefined8 *)(lVar27 + 0x10) = local_2b8;
                        *(ulong *)(lVar27 + 0x18) = uStack_2b0;
                      }
                      if (*(ulong **)&pgVar20[1].block_length == (ulong *)0x0) {
                        uVar26 = 0;
                      }
                      else {
                        uVar26 = **(ulong **)&pgVar20[1].block_length;
                      }
                      if (uVar26 != 0) {
                        uVar25 = 0;
                        do {
                          if (uVar25 < **(ulong **)&pgVar20[1].block_length) {
                            lVar27 = *(long *)((*(ulong **)&pgVar20[1].block_length)[2] + uVar25 * 8
                                              );
                          }
                          else {
                            lVar27 = 0;
                          }
                          if (lVar27 != 0) {
                            *(char **)(lVar27 + 0x30) = local_260;
                            *(undefined8 *)(lVar27 + 0x20) = local_2a8;
                            *(undefined8 *)(lVar27 + 0x28) = uStack_2a0;
                            *(undefined8 *)(lVar27 + 0x10) = local_2b8;
                            *(ulong *)(lVar27 + 0x18) = uStack_2b0;
                          }
                          uVar25 = uVar25 + 1;
                        } while (uVar26 != uVar25);
                      }
                    }
                    local_258 = pgVar20;
                    if (local_290 == (gnode_r *)0x0) {
                      local_290 = gnode_array_create();
                    }
                    if (uVar32 != 0) {
                      sVar4 = local_290->m;
                      if (local_290->n == sVar4) {
                        sVar31 = sVar4 * 2;
                        if (sVar4 == 0) {
                          sVar31 = 8;
                        }
                        local_290->m = sVar31;
                        ppgVar21 = (gnode_t **)realloc(local_290->p,sVar31 << 3);
                        local_290->p = ppgVar21;
                      }
                      sVar4 = parser->declarations->n;
                      if (sVar4 == 0) {
                        pgVar20 = (gnode_t *)0x0;
                      }
                      else {
                        pgVar20 = parser->declarations->p[sVar4 - 1];
                      }
                      token_01.colno = uStack_278;
                      token_01.type = local_280;
                      token_01.lineno = uStack_27c;
                      token_01.position = uStack_274;
                      token_01.bytes = local_270;
                      token_01.length = uStack_26c;
                      token_01.fileid = uStack_268;
                      token_01.builtin = iStack_264;
                      token_01.value = local_260;
                      pgVar20 = gnode_literal_string_expr_create
                                          (token_01,local_250,uVar32,true,pgVar20);
                      sVar4 = local_290->n;
                      local_290->n = sVar4 + 1;
                      local_290->p[sVar4] = pgVar20;
                    }
                    sVar4 = local_290->m;
                    if (local_290->n == sVar4) {
                      sVar31 = sVar4 * 2;
                      if (sVar4 == 0) {
                        sVar31 = 8;
                      }
                      local_290->m = sVar31;
                      ppgVar21 = (gnode_t **)realloc(local_290->p,sVar31 << 3);
                      local_290->p = ppgVar21;
                    }
                    sVar4 = local_290->n;
                    local_290->n = sVar4 + 1;
                    local_290->p[sVar4] = local_258;
                    pgVar20 = local_258;
                  }
                  parser->lexer->n = parser->lexer->n - 1;
                  gravity_lexer_free(local_248);
                  if (pgVar20 != (gnode_t *)0x0) {
                    uVar33 = 0;
                    pcVar17 = (char *)gravity_calloc((gravity_vm *)0x0,1,local_240);
                    iVar30 = 3;
                    uVar26 = (ulong)uVar13;
                    goto LAB_0010d6ec;
                  }
                }
                else {
                  report_error(parser,GRAVITY_ERROR_SYNTAX,0x141aa1);
                }
                iVar30 = 4;
                uVar26 = (ulong)uVar13;
                pcVar17 = local_250;
                goto LAB_0010d6ec;
              }
            }
            else {
              if (bVar12 == 0x55) {
                if (uVar29 + 9 < uVar7) {
                  local_238 = (undefined1  [2])
                              CONCAT11(*(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 3)),
                                       *(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 2)));
                  _local_238 = CONCAT12(*(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 4)),
                                        local_238);
                  _local_238 = CONCAT13(*(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 5)),
                                        _local_238);
                  _local_238 = CONCAT14(*(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 6)),
                                        _local_238);
                  _local_238 = CONCAT17(*(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 9)),
                                        CONCAT16(*(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 8)
                                                          ),
                                                 CONCAT15(*(char *)((long)&pgVar14->tag +
                                                                   (ulong)(uVar29 + 7)),_local_238))
                                       );
                  uStack_230 = uStack_230 & 0xffffffffffffff00;
                  uVar26 = strtoul(local_238,(char **)0x0,0x10);
                  uVar13 = utf8_encode(pcVar17 + uVar33,(uint32_t)uVar26);
                  uVar33 = (ulong)(uVar32 + uVar13);
                  uVar26 = (ulong)(uVar29 + 10);
                  goto LAB_0010d548;
                }
                goto LAB_0010d552;
              }
              uVar28 = uVar24;
              if ((bVar12 != 0x5c) &&
                 (bVar35 = bVar12 == 0x61, bVar12 = 0x5c, uVar28 = uVar29, bVar35)) {
                bVar12 = 7;
                uVar28 = uVar24;
              }
            }
            goto LAB_0010d6dc;
          }
          switch(bVar12) {
          case 0x6e:
            bVar12 = 10;
            uVar28 = uVar24;
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
          case 0x77:
switchD_0010d36e_caseD_6f:
            bVar12 = 0x5c;
            uVar28 = uVar29;
            break;
          case 0x72:
            bVar12 = 0xd;
            uVar28 = uVar24;
            break;
          case 0x74:
            bVar12 = 9;
            uVar28 = uVar24;
            break;
          case 0x75:
            if (uVar7 <= uVar29 + 5) goto LAB_0010d552;
            local_238 = (undefined1  [2])
                        CONCAT11(*(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 3)),
                                 *(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 2)));
            _local_238 = CONCAT12(*(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 4)),local_238);
            _local_238 = CONCAT13(*(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 5)),_local_238);
            _cStack_233 = SUB83(uVar11,5);
            _local_238 = (uint5)_local_238;
            uVar26 = strtoul(local_238,(char **)0x0,0x10);
            uVar13 = utf8_encode(pcVar17 + uVar33,(uint32_t)uVar26);
            uVar33 = (ulong)(uVar32 + uVar13);
            uVar26 = (ulong)(uVar29 + 6);
LAB_0010d548:
            iVar30 = 3;
            goto LAB_0010d6ec;
          case 0x76:
            bVar12 = 0xb;
            uVar28 = uVar24;
            break;
          case 0x78:
            if (uVar29 + 3 < uVar7) {
              local_238 = (undefined1  [2])
                          CONCAT11(*(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 3)),
                                   *(char *)((long)&pgVar14->tag + (ulong)(uVar29 + 2)));
              _local_238 = CONCAT12(0,local_238);
              uVar26 = strtoul(local_238,(char **)0x0,0x10);
              pcVar17[uVar33] = (char)uVar26;
              uVar26 = (ulong)(uVar29 + 4);
              uVar33 = (ulong)(uVar32 + 1);
              goto LAB_0010d548;
            }
LAB_0010d552:
            report_error(parser,GRAVITY_ERROR_SYNTAX,0x141a7a);
            iVar30 = 4;
            goto LAB_0010d6ec;
          default:
            if (bVar12 == 0x62) {
              bVar12 = 8;
              uVar28 = uVar24;
            }
            else {
              bVar35 = bVar12 == 0x66;
              bVar12 = 0x5c;
              if (bVar35) {
                bVar12 = 0xc;
                uVar28 = uVar24;
              }
            }
          }
LAB_0010d6dc:
          pcVar17[uVar33] = bVar12;
          uVar33 = (ulong)(uVar32 + 1);
          iVar30 = 0;
          uVar26 = (ulong)(uVar28 + 1);
LAB_0010d6ec:
          uVar32 = (uint32_t)uVar33;
          if ((iVar30 != 3) && (iVar30 != 0)) goto LAB_0010d9dc;
        } while ((uint)uVar26 < uVar7);
        iVar30 = 2;
      }
LAB_0010d9dc:
      if ((iVar30 != 4) && (iVar30 != 2)) {
        return pgVar14;
      }
      if ((local_290 != (gnode_r *)0x0) && (uVar32 != 0)) {
        sVar4 = local_290->m;
        if (local_290->n == sVar4) {
          sVar31 = 8;
          if (sVar4 != 0) {
            sVar31 = sVar4 * 2;
          }
          local_290->m = sVar31;
          ppgVar21 = (gnode_t **)realloc(local_290->p,sVar31 << 3);
          local_290->p = ppgVar21;
        }
        sVar4 = parser->declarations->n;
        if (sVar4 == 0) {
          pgVar14 = (gnode_t *)0x0;
        }
        else {
          pgVar14 = parser->declarations->p[sVar4 - 1];
        }
        token_06.lineno = uStack_27c;
        token_06.type = local_280;
        token_06.colno = uStack_278;
        token_06.position = uStack_274;
        token_06.bytes = local_270;
        token_06.length = uStack_26c;
        token_06.fileid = uStack_268;
        token_06.builtin = iStack_264;
        token_06.value = local_260;
        pgVar14 = gnode_literal_string_expr_create(token_06,pcVar17,uVar32,true,pgVar14);
        sVar4 = local_290->n;
        local_290->n = sVar4 + 1;
        local_290->p[sVar4] = pgVar14;
      }
      pgVar6 = parser->declarations;
      sVar4 = pgVar6->n;
      if (local_290 != (gnode_r *)0x0) {
        if (sVar4 == 0) {
          pgVar14 = (gnode_t *)0x0;
        }
        else {
          pgVar14 = pgVar6->p[sVar4 - 1];
        }
        token_07.lineno = uStack_27c;
        token_07.type = local_280;
        token_07.colno = uStack_278;
        token_07.position = uStack_274;
        token_07.bytes = local_270;
        token_07.length = uStack_26c;
        token_07.fileid = uStack_268;
        token_07.builtin = iStack_264;
        token_07.value = local_260;
        pgVar14 = gnode_string_interpolation_create(token_07,local_290,pgVar14);
        return pgVar14;
      }
      if (sVar4 == 0) {
        pgVar14 = (gnode_t *)0x0;
      }
      else {
        pgVar14 = pgVar6->p[sVar4 - 1];
      }
      allocated = true;
      goto LAB_0010d990;
    }
    pcVar15 = (*pgVar3->filename_callback)(uStack_268,pgVar3->xdata);
    pcVar17 = "";
    if (pcVar15 != (char *)0x0) {
      pcVar17 = pcVar15;
    }
    sVar16 = strlen(pcVar17);
    uVar32 = (uint32_t)sVar16;
    sVar4 = parser->declarations->n;
    if (sVar4 == 0) {
      pgVar14 = (gnode_t *)0x0;
    }
    else {
      pgVar14 = parser->declarations->p[sVar4 - 1];
    }
  }
  allocated = false;
LAB_0010d990:
  token_03.lineno = uStack_27c;
  token_03.type = local_280;
  token_03.colno = uStack_278;
  token_03.position = uStack_274;
  token_03.bytes = local_270;
  token_03.length = uStack_26c;
  token_03.fileid = uStack_268;
  token_03.builtin = iStack_264;
  token_03.value = local_260;
  pgVar14 = gnode_literal_string_expr_create(token_03,pcVar17,uVar32,allocated,pgVar14);
  return pgVar14;
}

Assistant:

gnode_t *parse_literal_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_literal_expression");
    DECLARE_LEXER;

    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);

    if (type == TOK_STRING) {
        uint32_t len = 0;
        const char *value = token_string(token, &len);
        DEBUG_PARSER("STRING: %.*s", len, value);
        // run string analyzer because string is returned as is from the lexer
        // but string can contains escaping sequences and interpolations that
        // need to be processed
        return parse_analyze_literal_string(parser, token, value, len);
    }

    if (type == TOK_KEY_TRUE || type == TOK_KEY_FALSE) {
        return gnode_literal_bool_expr_create(token, (int32_t)(type == TOK_KEY_TRUE) ? 1 : 0, LAST_DECLARATION());
    }

    if (type != TOK_NUMBER) {
        REPORT_ERROR(token, "Expected literal expression but found %s.", token_name(type));
        return NULL;
    }

    return parse_number_expression(parser, token);
}